

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

uint32_t __thiscall Jinx::Impl::Parser::GetOperatorPrecedence(Parser *this,Opcode opcode)

{
  Opcode opcode_local;
  Parser *this_local;
  
  switch(opcode) {
  case Add:
    this_local._4_4_ = 2;
    break;
  case And:
    this_local._4_4_ = 4;
    break;
  default:
    __assert_fail("!\"Unknown opcode used in binary expression\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                  ,0xbb,"uint32_t Jinx::Impl::Parser::GetOperatorPrecedence(Opcode) const");
  case Divide:
    this_local._4_4_ = 1;
    break;
  case Equals:
    this_local._4_4_ = 3;
    break;
  case Greater:
    this_local._4_4_ = 3;
    break;
  case GreaterEq:
    this_local._4_4_ = 3;
    break;
  case Less:
    this_local._4_4_ = 3;
    break;
  case LessEq:
    this_local._4_4_ = 3;
    break;
  case Mod:
    this_local._4_4_ = 1;
    break;
  case Multiply:
    this_local._4_4_ = 1;
    break;
  case NotEquals:
    this_local._4_4_ = 3;
    break;
  case Or:
    this_local._4_4_ = 4;
    break;
  case Subtract:
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

inline_t uint32_t Parser::GetOperatorPrecedence(Opcode opcode) const
	{
		// Lower values mean higher precedence
		switch (opcode)
		{
		case Opcode::Multiply: return 1;
		case Opcode::Divide: return 1;
		case Opcode::Mod: return 1;
		case Opcode::Add: return 2;
		case Opcode::Subtract: return 2;
		case Opcode::Less: return 3;
		case Opcode::LessEq: return 3;
		case Opcode::Greater: return 3;
		case Opcode::GreaterEq: return 3;
		case Opcode::Equals: return 3;
		case Opcode::NotEquals: return 3;
		case Opcode::And: return 4;
		case Opcode::Or: return 4;
		default:
			assert(!"Unknown opcode used in binary expression");
			return 0;
		};
	}